

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

void __thiscall
kj::HashIndex<kj::HashMap<int,_kj::String>::Callbacks>::rehash
          (HashIndex<kj::HashMap<int,_kj::String>::Callbacks> *this,size_t targetSize)

{
  size_t in_R8;
  ArrayPtr<const_kj::_::HashBucket> oldBuckets;
  Array<kj::_::HashBucket> local_30;
  
  oldBuckets.size_ = targetSize;
  oldBuckets.ptr = *(HashBucket **)(this + 0x18);
  _::rehash(&local_30,*(_ **)(this + 0x10),oldBuckets,in_R8);
  Array<kj::_::HashBucket>::operator=((Array<kj::_::HashBucket> *)(this + 0x10),&local_30);
  Array<kj::_::HashBucket>::~Array(&local_30);
  *(undefined8 *)(this + 8) = 0;
  return;
}

Assistant:

void rehash(size_t targetSize) {
    buckets = _::rehash(buckets, targetSize);
    erasedCount = 0;
  }